

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_codestream_info_v2_t * j2k_get_cstr_info(opj_j2k_t *p_j2k)

{
  OPJ_UINT32 OVar1;
  opj_tccp_t *poVar2;
  uint uVar3;
  opj_tccp_info_t *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  opj_codestream_info_v2_t *cstr_info;
  opj_codestream_info_v2_t *local_50;
  ulong local_48;
  long local_40;
  opj_tcp_t *local_38;
  
  local_48 = (ulong)p_j2k->m_private_image->numcomps;
  local_50 = (opj_codestream_info_v2_t *)opj_calloc(1,0x48);
  if (local_50 != (opj_codestream_info_v2_t *)0x0) {
    uVar3 = p_j2k->m_private_image->numcomps;
    local_50->nbcomps = uVar3;
    local_50->tx0 = (p_j2k->m_cp).tx0;
    local_50->ty0 = (p_j2k->m_cp).ty0;
    local_50->tdx = (p_j2k->m_cp).tdx;
    local_50->tdy = (p_j2k->m_cp).tdy;
    local_50->tw = (p_j2k->m_cp).tw;
    local_50->th = (p_j2k->m_cp).th;
    local_50->tile_info = (opj_tile_info_v2_t *)0x0;
    local_38 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    (local_50->m_default_tile_info).csty = local_38->csty;
    (local_50->m_default_tile_info).prg = local_38->prg;
    (local_50->m_default_tile_info).numlayers = local_38->numlayers;
    (local_50->m_default_tile_info).mct = local_38->mct;
    poVar4 = (opj_tccp_info_t *)opj_calloc((ulong)uVar3,0x438);
    (local_50->m_default_tile_info).tccp_info = poVar4;
    if (poVar4 != (opj_tccp_info_t *)0x0) {
      if (local_48 == 0) {
        return local_50;
      }
      local_40 = 0x1a4;
      lVar6 = 0x20;
      uVar7 = 0;
      do {
        poVar2 = local_38->tccps;
        poVar4 = (local_50->m_default_tile_info).tccp_info;
        poVar4[uVar7].csty = poVar2[uVar7].csty;
        uVar3 = poVar2[uVar7].numresolutions;
        poVar4[uVar7].numresolutions = uVar3;
        poVar4[uVar7].cblkw = poVar2[uVar7].cblkw;
        poVar4[uVar7].cblkh = poVar2[uVar7].cblkh;
        poVar4[uVar7].cblksty = poVar2[uVar7].cblksty;
        poVar4[uVar7].qmfbid = poVar2[uVar7].qmfbid;
        if ((ulong)uVar3 < 0x21) {
          memcpy(poVar4[uVar7].prch,poVar2[uVar7].prch,(ulong)uVar3);
          memcpy(poVar4[uVar7].prcw,poVar2[uVar7].prcw,(ulong)poVar2[uVar7].numresolutions);
        }
        OVar1 = poVar2[uVar7].qntsty;
        poVar4[uVar7].qntsty = OVar1;
        poVar4[uVar7].numgbits = poVar2[uVar7].numgbits;
        uVar3 = 1;
        if (OVar1 != 1) {
          uVar3 = poVar2[uVar7].numresolutions * 3 - 2;
        }
        if (uVar3 - 1 < 0x60) {
          uVar5 = 0;
          do {
            *(undefined4 *)((long)poVar4 + uVar5 * 4 + local_40 + -0x184) =
                 *(undefined4 *)((long)poVar2->stepsizes + uVar5 * 8 + lVar6 + -0x1c);
            *(undefined4 *)((long)poVar4->stepsizes_mant + uVar5 * 4 + local_40 + -0x20) =
                 *(undefined4 *)((long)&poVar2->stepsizes[uVar5 - 4].expn + lVar6);
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        poVar4[uVar7].roishift = poVar2[uVar7].roishift;
        uVar7 = uVar7 + 1;
        local_40 = local_40 + 0x438;
        lVar6 = lVar6 + 0x438;
      } while (uVar7 != local_48);
      return local_50;
    }
    opj_destroy_cstr_info(&local_50);
  }
  return (opj_codestream_info_v2_t *)0x0;
}

Assistant:

opj_codestream_info_v2_t* j2k_get_cstr_info(opj_j2k_t* p_j2k)
{
        OPJ_UINT32 compno;
        OPJ_UINT32 numcomps = p_j2k->m_private_image->numcomps;
        opj_tcp_t *l_default_tile;
        opj_codestream_info_v2_t* cstr_info = (opj_codestream_info_v2_t*) opj_calloc(1,sizeof(opj_codestream_info_v2_t));
		if (!cstr_info)
			return NULL;

        cstr_info->nbcomps = p_j2k->m_private_image->numcomps;

        cstr_info->tx0 = p_j2k->m_cp.tx0;
        cstr_info->ty0 = p_j2k->m_cp.ty0;
        cstr_info->tdx = p_j2k->m_cp.tdx;
        cstr_info->tdy = p_j2k->m_cp.tdy;
        cstr_info->tw = p_j2k->m_cp.tw;
        cstr_info->th = p_j2k->m_cp.th;

        cstr_info->tile_info = NULL; /* Not fill from the main header*/

        l_default_tile = p_j2k->m_specific_param.m_decoder.m_default_tcp;

        cstr_info->m_default_tile_info.csty = l_default_tile->csty;
        cstr_info->m_default_tile_info.prg = l_default_tile->prg;
        cstr_info->m_default_tile_info.numlayers = l_default_tile->numlayers;
        cstr_info->m_default_tile_info.mct = l_default_tile->mct;

        cstr_info->m_default_tile_info.tccp_info = (opj_tccp_info_t*) opj_calloc(cstr_info->nbcomps, sizeof(opj_tccp_info_t));
		if (!cstr_info->m_default_tile_info.tccp_info)
		{
			opj_destroy_cstr_info(&cstr_info);
			return NULL;
		}

        for (compno = 0; compno < numcomps; compno++) {
                opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
                opj_tccp_info_t *l_tccp_info = &(cstr_info->m_default_tile_info.tccp_info[compno]);
                OPJ_INT32 bandno, numbands;

                /* coding style*/
                l_tccp_info->csty = l_tccp->csty;
                l_tccp_info->numresolutions = l_tccp->numresolutions;
                l_tccp_info->cblkw = l_tccp->cblkw;
                l_tccp_info->cblkh = l_tccp->cblkh;
                l_tccp_info->cblksty = l_tccp->cblksty;
                l_tccp_info->qmfbid = l_tccp->qmfbid;
                if (l_tccp->numresolutions < OPJ_J2K_MAXRLVLS)
                {
                        memcpy(l_tccp_info->prch, l_tccp->prch, l_tccp->numresolutions);
                        memcpy(l_tccp_info->prcw, l_tccp->prcw, l_tccp->numresolutions);
                }

                /* quantization style*/
                l_tccp_info->qntsty = l_tccp->qntsty;
                l_tccp_info->numgbits = l_tccp->numgbits;

                numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 : (OPJ_INT32)l_tccp->numresolutions * 3 - 2;
                if (numbands < OPJ_J2K_MAXBANDS) {
                        for (bandno = 0; bandno < numbands; bandno++) {
                                l_tccp_info->stepsizes_mant[bandno] = (OPJ_UINT32)l_tccp->stepsizes[bandno].mant;
                                l_tccp_info->stepsizes_expn[bandno] = (OPJ_UINT32)l_tccp->stepsizes[bandno].expn;
                        }
                }

                /* RGN value*/
                l_tccp_info->roishift = l_tccp->roishift;
        }

        return cstr_info;
}